

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O3

void __thiscall
WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::~WorkerQueue(WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *this)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  
  LOCK();
  this[0xa8] = (WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                )0x1;
  UNLOCK();
  std::condition_variable::notify_all();
  plVar4 = *(long **)(this + 0x10);
  plVar1 = *(long **)(this + 0x30);
  if (plVar4 != plVar1) {
    plVar3 = *(long **)(this + 0x20);
    lVar2 = *(long *)(this + 0x28);
    do {
      if (*plVar4 != 0) {
        std::thread::join();
      }
      plVar4 = plVar4 + 1;
      if (plVar4 == plVar3) {
        plVar4 = *(long **)(lVar2 + 8);
        lVar2 = lVar2 + 8;
        plVar3 = plVar4 + 0x40;
      }
    } while (plVar4 != plVar1);
  }
  std::
  deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::~deque((deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
            *)(this + 0x110));
  std::
  deque<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_std::allocator<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>_>_>
  ::~deque((deque<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_std::allocator<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>_>_>
            *)(this + 0xb0));
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x50));
  std::deque<std::thread,_std::allocator<std::thread>_>::~deque
            ((deque<std::thread,_std::allocator<std::thread>_> *)this);
  return;
}

Assistant:

~WorkerQueue() {
    mStop = true;
    mCondition.notify_all();
    for( auto& worker : mWorkers ) {
      if( worker.joinable() ) {
        worker.join();
      }
    }
  }